

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

Node * __thiscall llvm::yaml::Document::parseBlockNode(Document *this)

{
  Stream *pSVar1;
  StringRef Val;
  StringRef RawVal;
  StringRef Tag;
  StringRef Tag_00;
  StringRef Tag_01;
  StringRef Tag_02;
  StringRef Tag_03;
  StringRef Tag_04;
  StringRef Tag_05;
  StringRef Tag_06;
  bool bVar2;
  Token *pTVar3;
  char *data;
  long lVar4;
  Document *pDVar5;
  StringRef SVar6;
  Document *local_7e0;
  Document *local_7c0;
  Document *local_790;
  Document *local_760;
  Document *local_700;
  Document *local_6d0;
  Document *local_6a0;
  Document *local_670;
  Document *local_640;
  Document *local_610;
  Document *local_5b8;
  Twine local_5a0;
  undefined1 local_581;
  BumpPtrAllocator *local_580;
  Document *local_578;
  undefined1 local_569;
  BumpPtrAllocator *local_568;
  Document *local_560;
  undefined1 local_558 [24];
  StringRef local_540;
  undefined1 local_529;
  BumpPtrAllocator *local_528;
  Document *local_520;
  undefined1 local_518 [32];
  undefined1 local_4f8 [48];
  Document *local_4c8;
  StringRef local_4c0;
  char *pcStack_4b0;
  StringRef StrCopy;
  StringRef NullTerminatedStr;
  Token local_410;
  undefined1 local_3d8 [48];
  Document *local_3a8;
  Token local_3a0;
  undefined1 local_368 [48];
  Document *local_338;
  Token local_330;
  undefined1 local_2f8 [48];
  Document *local_2c8;
  Token local_2c0;
  undefined1 local_288 [48];
  Document *local_258;
  Token local_250;
  undefined1 local_218 [24];
  StringRef local_200;
  undefined1 local_1e9;
  BumpPtrAllocator *local_1e8;
  Document *local_1e0;
  Token local_1d8;
  Twine local_1a0;
  Token local_188;
  Twine local_150;
  undefined4 local_134;
  StringRef local_130;
  undefined1 local_119;
  BumpPtrAllocator *local_118;
  Document *local_110;
  Token local_f8;
  undefined1 local_c0 [8];
  Token TagInfo;
  Token AnchorInfo;
  Token T;
  Document *this_local;
  
  T.Value.field_2._8_8_ = this;
  pTVar3 = peekNext(this);
  Token::Token((Token *)((long)&AnchorInfo.Value.field_2 + 8),pTVar3);
  Token::Token((Token *)((long)&TagInfo.Value.field_2 + 8));
  Token::Token((Token *)local_c0);
LAB_028a6c90:
  do {
    if (AnchorInfo.Value.field_2._8_4_ == 0x14) {
      getNext(&local_f8,this);
      Token::~Token(&local_f8);
      pDVar5 = (Document *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
      local_119 = 0;
      local_5b8 = (Document *)0x0;
      if (pDVar5 != (Document *)0x0) {
        local_119 = 1;
        pSVar1 = this->stream;
        local_118 = &this->NodeAllocator;
        local_110 = pDVar5;
        local_130 = StringRef::substr((StringRef *)&T,1,0xffffffffffffffff);
        AliasNode::AliasNode((AliasNode *)pDVar5,&pSVar1->CurrentDoc,local_130);
        local_5b8 = pDVar5;
      }
      this_local = local_5b8;
LAB_028a7f48:
      local_134 = 1;
      Token::~Token((Token *)local_c0);
      Token::~Token((Token *)((long)&TagInfo.Value.field_2 + 8));
      Token::~Token((Token *)((long)&AnchorInfo.Value.field_2 + 8));
      return (Node *)this_local;
    }
    if (AnchorInfo.Value.field_2._8_4_ != 0x15) {
      if (AnchorInfo.Value.field_2._8_4_ != 0x16) {
        switch(AnchorInfo.Value.field_2._8_4_) {
        case 0:
          this_local = (Document *)0x0;
          break;
        case 2:
        case 5:
        case 6:
        default:
          pDVar5 = (Document *)Node::operator_new(0x48,&this->NodeAllocator,0x10);
          local_569 = 0;
          local_7c0 = (Document *)0x0;
          if (pDVar5 != (Document *)0x0) {
            local_569 = 1;
            local_568 = &this->NodeAllocator;
            local_560 = pDVar5;
            NullNode::NullNode((NullNode *)pDVar5,&this->stream->CurrentDoc);
            local_7c0 = pDVar5;
          }
          this_local = local_7c0;
          break;
        case 7:
          pDVar5 = (Document *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
          local_1e9 = 0;
          local_610 = (Document *)0x0;
          if (pDVar5 != (Document *)0x0) {
            local_1e9 = 1;
            pSVar1 = this->stream;
            local_1e8 = &this->NodeAllocator;
            local_1e0 = pDVar5;
            local_200 = StringRef::substr((StringRef *)&AnchorInfo,1,0xffffffffffffffff);
            local_218._0_8_ = TagInfo._0_8_;
            local_218._8_8_ = TagInfo.Range.Data;
            Tag_06.Length = (size_t)TagInfo.Range.Data;
            Tag_06.Data = (char *)TagInfo._0_8_;
            SequenceNode::SequenceNode
                      ((SequenceNode *)pDVar5,&pSVar1->CurrentDoc,local_200,Tag_06,ST_Indentless);
            local_610 = pDVar5;
          }
          this_local = local_610;
          break;
        case 9:
          getNext(&local_250,this);
          Token::~Token(&local_250);
          pDVar5 = (Document *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
          local_288[0x27] = 0;
          local_640 = (Document *)0x0;
          if (pDVar5 != (Document *)0x0) {
            local_288[0x27] = 1;
            pSVar1 = this->stream;
            local_288._40_8_ = &this->NodeAllocator;
            local_258 = pDVar5;
            local_288._16_16_ =
                 (undefined1  [16])StringRef::substr((StringRef *)&AnchorInfo,1,0xffffffffffffffff);
            local_288._0_8_ = TagInfo._0_8_;
            local_288._8_8_ = TagInfo.Range.Data;
            Tag_05.Length = (size_t)TagInfo.Range.Data;
            Tag_05.Data = (char *)TagInfo._0_8_;
            SequenceNode::SequenceNode
                      ((SequenceNode *)pDVar5,&pSVar1->CurrentDoc,(StringRef)local_288._16_16_,
                       Tag_05,ST_Block);
            local_640 = pDVar5;
          }
          this_local = local_640;
          break;
        case 10:
          getNext(&local_2c0,this);
          Token::~Token(&local_2c0);
          pDVar5 = (Document *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
          local_2f8[0x27] = 0;
          local_670 = (Document *)0x0;
          if (pDVar5 != (Document *)0x0) {
            local_2f8[0x27] = 1;
            pSVar1 = this->stream;
            local_2f8._40_8_ = &this->NodeAllocator;
            local_2c8 = pDVar5;
            local_2f8._16_16_ =
                 (undefined1  [16])StringRef::substr((StringRef *)&AnchorInfo,1,0xffffffffffffffff);
            local_2f8._0_8_ = TagInfo._0_8_;
            local_2f8._8_8_ = TagInfo.Range.Data;
            Tag_04.Length = (size_t)TagInfo.Range.Data;
            Tag_04.Data = (char *)TagInfo._0_8_;
            MappingNode::MappingNode
                      ((MappingNode *)pDVar5,&pSVar1->CurrentDoc,(StringRef)local_2f8._16_16_,Tag_04
                       ,MT_Block);
            local_670 = pDVar5;
          }
          this_local = local_670;
          break;
        case 0xb:
        case 0xd:
        case 0xf:
          if ((this->Root == (Node *)0x0) ||
             ((bVar2 = isa<llvm::yaml::MappingNode,llvm::yaml::Node*>(&this->Root), !bVar2 &&
              (bVar2 = isa<llvm::yaml::SequenceNode,llvm::yaml::Node*>(&this->Root), !bVar2)))) {
            Twine::Twine(&local_5a0,"Unexpected token");
            setError(this,&local_5a0,(Token *)((long)&AnchorInfo.Value.field_2 + 8));
            this_local = (Document *)0x0;
          }
          else {
            pDVar5 = (Document *)Node::operator_new(0x48,&this->NodeAllocator,0x10);
            local_581 = 0;
            local_7e0 = (Document *)0x0;
            if (pDVar5 != (Document *)0x0) {
              local_581 = 1;
              local_580 = &this->NodeAllocator;
              local_578 = pDVar5;
              NullNode::NullNode((NullNode *)pDVar5,&this->stream->CurrentDoc);
              local_7e0 = pDVar5;
            }
            this_local = local_7e0;
          }
          break;
        case 0xc:
          getNext(&local_330,this);
          Token::~Token(&local_330);
          pDVar5 = (Document *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
          local_368[0x27] = 0;
          local_6a0 = (Document *)0x0;
          if (pDVar5 != (Document *)0x0) {
            local_368[0x27] = 1;
            pSVar1 = this->stream;
            local_368._40_8_ = &this->NodeAllocator;
            local_338 = pDVar5;
            local_368._16_16_ =
                 (undefined1  [16])StringRef::substr((StringRef *)&AnchorInfo,1,0xffffffffffffffff);
            local_368._0_8_ = TagInfo._0_8_;
            local_368._8_8_ = TagInfo.Range.Data;
            Tag_03.Length = (size_t)TagInfo.Range.Data;
            Tag_03.Data = (char *)TagInfo._0_8_;
            SequenceNode::SequenceNode
                      ((SequenceNode *)pDVar5,&pSVar1->CurrentDoc,(StringRef)local_368._16_16_,
                       Tag_03,ST_Flow);
            local_6a0 = pDVar5;
          }
          this_local = local_6a0;
          break;
        case 0xe:
          getNext(&local_3a0,this);
          Token::~Token(&local_3a0);
          pDVar5 = (Document *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
          local_3d8[0x27] = 0;
          local_6d0 = (Document *)0x0;
          if (pDVar5 != (Document *)0x0) {
            local_3d8[0x27] = 1;
            pSVar1 = this->stream;
            local_3d8._40_8_ = &this->NodeAllocator;
            local_3a8 = pDVar5;
            local_3d8._16_16_ =
                 (undefined1  [16])StringRef::substr((StringRef *)&AnchorInfo,1,0xffffffffffffffff);
            local_3d8._0_8_ = TagInfo._0_8_;
            local_3d8._8_8_ = TagInfo.Range.Data;
            Tag_02.Length = (size_t)TagInfo.Range.Data;
            Tag_02.Data = (char *)TagInfo._0_8_;
            MappingNode::MappingNode
                      ((MappingNode *)pDVar5,&pSVar1->CurrentDoc,(StringRef)local_3d8._16_16_,Tag_02
                       ,MT_Flow);
            local_6d0 = pDVar5;
          }
          this_local = local_6d0;
          break;
        case 0x10:
          pDVar5 = (Document *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
          local_529 = 0;
          local_790 = (Document *)0x0;
          if (pDVar5 != (Document *)0x0) {
            local_529 = 1;
            pSVar1 = this->stream;
            local_528 = &this->NodeAllocator;
            local_520 = pDVar5;
            local_540 = StringRef::substr((StringRef *)&AnchorInfo,1,0xffffffffffffffff);
            local_558._0_8_ = TagInfo._0_8_;
            local_558._8_8_ = TagInfo.Range.Data;
            Tag.Length = (size_t)TagInfo.Range.Data;
            Tag.Data = (char *)TagInfo._0_8_;
            MappingNode::MappingNode
                      ((MappingNode *)pDVar5,&pSVar1->CurrentDoc,local_540,Tag,MT_Inline);
            local_790 = pDVar5;
          }
          this_local = local_790;
          break;
        case 0x12:
          getNext(&local_410,this);
          Token::~Token(&local_410);
          pDVar5 = (Document *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
          local_700 = (Document *)0x0;
          if (pDVar5 != (Document *)0x0) {
            pSVar1 = this->stream;
            SVar6 = StringRef::substr((StringRef *)&AnchorInfo,1,0xffffffffffffffff);
            Tag_01.Length = (size_t)TagInfo.Range.Data;
            Tag_01.Data = (char *)TagInfo._0_8_;
            Val.Length = (size_t)T.Range.Data;
            Val.Data = (char *)T._0_8_;
            ScalarNode::ScalarNode((ScalarNode *)pDVar5,&pSVar1->CurrentDoc,SVar6,Tag_01,Val);
            local_700 = pDVar5;
          }
          this_local = local_700;
          break;
        case 0x13:
          getNext((Token *)&NullTerminatedStr.Length,this);
          Token::~Token((Token *)&NullTerminatedStr.Length);
          data = (char *)std::__cxx11::string::c_str();
          lVar4 = std::__cxx11::string::length();
          StringRef::StringRef((StringRef *)&StrCopy.Length,data,lVar4 + 1);
          local_4c0 = StringRef::
                      copy<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>
                                ((StringRef *)&StrCopy.Length,&this->NodeAllocator);
          SVar6 = StringRef::drop_back(&local_4c0,1);
          StrCopy.Data = (char *)SVar6.Length;
          pcStack_4b0 = SVar6.Data;
          pDVar5 = (Document *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
          local_4f8[0x27] = 0;
          local_760 = (Document *)0x0;
          if (pDVar5 != (Document *)0x0) {
            local_4f8[0x27] = 1;
            pSVar1 = this->stream;
            local_4f8._40_8_ = &this->NodeAllocator;
            local_4c8 = pDVar5;
            local_4f8._16_16_ =
                 (undefined1  [16])StringRef::substr((StringRef *)&AnchorInfo,1,0xffffffffffffffff);
            local_4f8._0_8_ = TagInfo._0_8_;
            local_4f8._8_8_ = TagInfo.Range.Data;
            local_518._16_8_ = pcStack_4b0;
            local_518._24_8_ = StrCopy.Data;
            local_518._0_8_ = T._0_8_;
            local_518._8_8_ = T.Range.Data;
            Tag_00.Length = (size_t)TagInfo.Range.Data;
            Tag_00.Data = (char *)TagInfo._0_8_;
            SVar6.Length = (size_t)StrCopy.Data;
            SVar6.Data = pcStack_4b0;
            RawVal.Length = (size_t)T.Range.Data;
            RawVal.Data = (char *)T._0_8_;
            BlockScalarNode::BlockScalarNode
                      ((BlockScalarNode *)pDVar5,&pSVar1->CurrentDoc,(StringRef)local_4f8._16_16_,
                       Tag_00,SVar6,RawVal);
            local_760 = pDVar5;
          }
          this_local = local_760;
        }
        goto LAB_028a7f48;
      }
      if (local_c0._0_4_ == TK_Tag) {
        Twine::Twine(&local_1a0,"Already encountered a tag for this node!");
        setError(this,&local_1a0,(Token *)((long)&AnchorInfo.Value.field_2 + 8));
        this_local = (Document *)0x0;
        goto LAB_028a7f48;
      }
      getNext(&local_1d8,this);
      Token::operator=((Token *)local_c0,&local_1d8);
      Token::~Token(&local_1d8);
      pTVar3 = peekNext(this);
      Token::operator=((Token *)((long)&AnchorInfo.Value.field_2 + 8),pTVar3);
      goto LAB_028a6c90;
    }
    if (TagInfo.Value.field_2._8_4_ == 0x15) {
      Twine::Twine(&local_150,"Already encountered an anchor for this node!");
      setError(this,&local_150,(Token *)((long)&AnchorInfo.Value.field_2 + 8));
      this_local = (Document *)0x0;
      goto LAB_028a7f48;
    }
    getNext(&local_188,this);
    Token::operator=((Token *)((long)&TagInfo.Value.field_2 + 8),&local_188);
    Token::~Token(&local_188);
    pTVar3 = peekNext(this);
    Token::operator=((Token *)((long)&AnchorInfo.Value.field_2 + 8),pTVar3);
  } while( true );
}

Assistant:

Node *Document::parseBlockNode() {
  Token T = peekNext();
  // Handle properties.
  Token AnchorInfo;
  Token TagInfo;
parse_property:
  switch (T.Kind) {
  case Token::TK_Alias:
    getNext();
    return new (NodeAllocator) AliasNode(stream.CurrentDoc, T.Range.substr(1));
  case Token::TK_Anchor:
    if (AnchorInfo.Kind == Token::TK_Anchor) {
      setError("Already encountered an anchor for this node!", T);
      return nullptr;
    }
    AnchorInfo = getNext(); // Consume TK_Anchor.
    T = peekNext();
    goto parse_property;
  case Token::TK_Tag:
    if (TagInfo.Kind == Token::TK_Tag) {
      setError("Already encountered a tag for this node!", T);
      return nullptr;
    }
    TagInfo = getNext(); // Consume TK_Tag.
    T = peekNext();
    goto parse_property;
  default:
    break;
  }

  switch (T.Kind) {
  case Token::TK_BlockEntry:
    // We got an unindented BlockEntry sequence. This is not terminated with
    // a BlockEnd.
    // Don't eat the TK_BlockEntry, SequenceNode needs it.
    return new (NodeAllocator) SequenceNode( stream.CurrentDoc
                                           , AnchorInfo.Range.substr(1)
                                           , TagInfo.Range
                                           , SequenceNode::ST_Indentless);
  case Token::TK_BlockSequenceStart:
    getNext();
    return new (NodeAllocator)
      SequenceNode( stream.CurrentDoc
                  , AnchorInfo.Range.substr(1)
                  , TagInfo.Range
                  , SequenceNode::ST_Block);
  case Token::TK_BlockMappingStart:
    getNext();
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Block);
  case Token::TK_FlowSequenceStart:
    getNext();
    return new (NodeAllocator)
      SequenceNode( stream.CurrentDoc
                  , AnchorInfo.Range.substr(1)
                  , TagInfo.Range
                  , SequenceNode::ST_Flow);
  case Token::TK_FlowMappingStart:
    getNext();
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Flow);
  case Token::TK_Scalar:
    getNext();
    return new (NodeAllocator)
      ScalarNode( stream.CurrentDoc
                , AnchorInfo.Range.substr(1)
                , TagInfo.Range
                , T.Range);
  case Token::TK_BlockScalar: {
    getNext();
    StringRef NullTerminatedStr(T.Value.c_str(), T.Value.length() + 1);
    StringRef StrCopy = NullTerminatedStr.copy(NodeAllocator).drop_back();
    return new (NodeAllocator)
        BlockScalarNode(stream.CurrentDoc, AnchorInfo.Range.substr(1),
                        TagInfo.Range, StrCopy, T.Range);
  }
  case Token::TK_Key:
    // Don't eat the TK_Key, KeyValueNode expects it.
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Inline);
  case Token::TK_DocumentStart:
  case Token::TK_DocumentEnd:
  case Token::TK_StreamEnd:
  default:
    // TODO: Properly handle tags. "[!!str ]" should resolve to !!str "", not
    //       !!null null.
    return new (NodeAllocator) NullNode(stream.CurrentDoc);
  case Token::TK_FlowMappingEnd:
  case Token::TK_FlowSequenceEnd:
  case Token::TK_FlowEntry: {
    if (Root && (isa<MappingNode>(Root) || isa<SequenceNode>(Root)))
      return new (NodeAllocator) NullNode(stream.CurrentDoc);

    setError("Unexpected token", T);
    return nullptr;
  }
  case Token::TK_Error:
    return nullptr;
  }
  llvm_unreachable("Control flow shouldn't reach here.");
  return nullptr;
}